

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.c
# Opt level: O0

void rational_subtract(rational_t *n1,rational_t *n2,rational_t *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool local_48;
  byte local_47;
  _Bool valid;
  _Bool v4;
  _Bool v3;
  _Bool v2;
  _Bool v1;
  long lStack_40;
  _Bool v0;
  long diff;
  long den1_x_den2;
  long den1_num2_product;
  long num1_den2_product;
  rational_t *result_local;
  rational_t *n2_local;
  rational_t *n1_local;
  
  local_47 = 0;
  if ((n1->valid & 1U) != 0) {
    local_47 = n2->valid;
  }
  num1_den2_product = (long)result;
  result_local = n2;
  n2_local = n1;
  lVar1 = long_multiply(n1->num,n2->den,&den1_num2_product);
  lVar2 = long_multiply(result_local->num,n2_local->den,&den1_x_den2);
  lVar3 = long_multiply(n2_local->den,result_local->den,&diff);
  lVar4 = long_subtract(den1_num2_product,den1_x_den2,&stack0xffffffffffffffc0);
  local_48 = false;
  if (((((local_47 & 1) != 0) && (local_48 = false, lVar1 != 0)) && (local_48 = false, lVar2 != 0))
     && (local_48 = false, lVar3 != 0)) {
    local_48 = lVar4 != 0;
  }
  rational_internal_init((rational_t *)num1_den2_product,lStack_40,diff,local_48);
  return;
}

Assistant:

void rational_subtract(rational_t *n1,
                       rational_t *n2,
                       rational_t *result)
{
    long num1_den2_product, den1_num2_product, den1_x_den2, diff;
    bool v0 = n1->valid && n2->valid;
    bool v1 = long_multiply(n1->num, n2->den, &num1_den2_product);
    bool v2 = long_multiply(n2->num, n1->den, &den1_num2_product);
    bool v3 = long_multiply(n1->den, n2->den, &den1_x_den2);
    bool v4 = long_subtract(num1_den2_product, den1_num2_product, &diff);
    bool valid = v0 && v1 && v2 && v3 && v4;
    rational_internal_init(result, diff, den1_x_den2, valid);
}